

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O1

void Ga2_ManReportMemory(Ga2_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  bool bVar4;
  bool bVar5;
  double dVar6;
  long lVar7;
  int level;
  Rnm_Man_t *p_00;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  
  pVVar2 = p->pGia->vMapping;
  dVar8 = 0.0;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    dVar8 = (double)pVVar2->nCap * 4.0 + 16.0;
  }
  iVar1 = p->pGia->nObjsAlloc;
  dVar9 = sat_solver2_memory(p->pSat,1);
  dVar10 = sat_solver2_memory_proof(p->pSat);
  pVVar3 = p->vId2Lit;
  dVar14 = 0.0;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    dVar14 = (double)pVVar3->nCap * 8.0 + 16.0;
    if (0 < (long)pVVar3->nSize) {
      lVar7 = 0;
      do {
        if ((int *)pVVar3->pArray[lVar7] != (int *)0x0) {
          dVar14 = dVar14 + (double)*pVVar3->pArray[lVar7] * 4.0 + 16.0;
        }
        lVar7 = lVar7 + 1;
      } while (pVVar3->nSize != lVar7);
    }
  }
  p_00 = p->pRnm;
  dVar11 = Rnm_ManMemoryUsage(p_00);
  level = (int)p_00;
  pVVar3 = p->vCnfs;
  dVar20 = 0.0;
  dVar17 = 0.0;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    dVar17 = (double)pVVar3->nCap * 8.0 + 16.0;
    if (0 < (long)pVVar3->nSize) {
      lVar7 = 0;
      do {
        if ((int *)pVVar3->pArray[lVar7] != (int *)0x0) {
          dVar17 = dVar17 + (double)*pVVar3->pArray[lVar7] * 4.0 + 16.0;
        }
        lVar7 = lVar7 + 1;
      } while (pVVar3->nSize != lVar7);
    }
  }
  if (p->vIds != (Vec_Int_t *)0x0) {
    dVar20 = (double)p->vIds->nCap * 4.0 + 16.0;
  }
  dVar12 = 0.0;
  dVar18 = 0.0;
  if (p->vProofIds != (Vec_Int_t *)0x0) {
    dVar18 = (double)p->vProofIds->nCap * 4.0 + 16.0;
  }
  if (p->vAbs != (Vec_Int_t *)0x0) {
    dVar12 = (double)p->vAbs->nCap * 4.0 + 16.0;
  }
  dVar15 = 0.0;
  dVar16 = 0.0;
  if (p->vValues != (Vec_Int_t *)0x0) {
    dVar16 = (double)p->vValues->nCap * 4.0 + 16.0;
  }
  if (p->vLits != (Vec_Int_t *)0x0) {
    dVar15 = (double)p->vLits->nCap * 4.0 + 16.0;
  }
  dVar21 = 0.0;
  if (p->vIsopMem != (Vec_Int_t *)0x0) {
    dVar21 = (double)p->vIsopMem->nCap * 4.0 + 16.0;
  }
  lVar7 = (long)p->nTable * 0x18;
  auVar13._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar13._0_8_ = lVar7;
  auVar13._12_4_ = 0x45300000;
  dVar6 = (auVar13._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
  dVar18 = dVar17 + 224.0 + dVar20 + dVar18 + dVar12 + dVar16 + dVar15 + dVar21 + 926274.0;
  dVar8 = (double)iVar1 * 12.0 + dVar8;
  dVar17 = dVar8 + dVar9 + dVar10 + dVar14 + dVar11 + dVar6 + dVar18;
  Abc_Print(level,"%s =","Memory: AIG      ");
  bVar4 = NAN(dVar17);
  bVar5 = dVar17 == 0.0;
  dVar20 = (dVar8 * 100.0) / dVar17;
  if ((bVar5) && (!bVar4)) {
    dVar20 = 0.0;
  }
  dVar12 = (dVar9 * 100.0) / dVar17;
  if ((bVar5) && (!bVar4)) {
    dVar12 = 0.0;
  }
  dVar15 = (dVar10 * 100.0) / dVar17;
  if ((bVar5) && (!bVar4)) {
    dVar15 = 0.0;
  }
  dVar16 = (dVar14 * 100.0) / dVar17;
  if ((bVar5) && (!bVar4)) {
    dVar16 = 0.0;
  }
  dVar21 = (dVar11 * 100.0) / dVar17;
  if ((bVar5) && (!bVar4)) {
    dVar21 = 0.0;
  }
  dVar22 = (dVar18 * 100.0) / dVar17;
  if ((bVar5) && (!bVar4)) {
    dVar22 = 0.0;
  }
  dVar19 = (dVar17 * 100.0) / dVar17;
  if ((bVar5) && (!bVar4)) {
    dVar19 = 0.0;
  }
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar8 * 9.5367431640625e-07,dVar20);
  Abc_Print(level,"%s =","Memory: SAT      ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar9 * 9.5367431640625e-07,dVar12);
  Abc_Print(level,"%s =","Memory: Proof    ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar10 * 9.5367431640625e-07,dVar15);
  Abc_Print(level,"%s =","Memory: Map      ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar14 * 9.5367431640625e-07,dVar16);
  Abc_Print(level,"%s =","Memory: Refine   ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar11 * 9.5367431640625e-07,dVar21);
  Abc_Print(level,"%s =","Memory: Hash     ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar6 * 9.5367431640625e-07);
  Abc_Print(level,"%s =","Memory: Other    ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar18 * 9.5367431640625e-07,dVar22);
  Abc_Print(level,"%s =","Memory: TOTAL    ");
  Abc_Print(level,"%10.3f MB (%6.2f %%)\n",dVar17 * 9.5367431640625e-07,dVar19);
  return;
}

Assistant:

void Ga2_ManReportMemory( Ga2_Man_t * p )
{
    double memTot = 0;
    double memAig = 1.0 * p->pGia->nObjsAlloc * sizeof(Gia_Obj_t) + Vec_IntMemory(p->pGia->vMapping);
    double memSat = sat_solver2_memory( p->pSat, 1 );
    double memPro = sat_solver2_memory_proof( p->pSat );
    double memMap = Vec_VecMemoryInt( (Vec_Vec_t *)p->vId2Lit );
    double memRef = Rnm_ManMemoryUsage( p->pRnm );
    double memHash= sizeof(int) * 6 * p->nTable;
    double memOth = sizeof(Ga2_Man_t);
    memOth += Vec_VecMemoryInt( (Vec_Vec_t *)p->vCnfs );
    memOth += Vec_IntMemory( p->vIds );
    memOth += Vec_IntMemory( p->vProofIds );
    memOth += Vec_IntMemory( p->vAbs );
    memOth += Vec_IntMemory( p->vValues );
    memOth += Vec_IntMemory( p->vLits );
    memOth += Vec_IntMemory( p->vIsopMem );
    memOth += 336450 + (sizeof(char) + sizeof(char*)) * 65536;
    memTot = memAig + memSat + memPro + memMap + memRef + memHash + memOth;
    ABC_PRMP( "Memory: AIG      ", memAig, memTot );
    ABC_PRMP( "Memory: SAT      ", memSat, memTot );
    ABC_PRMP( "Memory: Proof    ", memPro, memTot );
    ABC_PRMP( "Memory: Map      ", memMap, memTot );
    ABC_PRMP( "Memory: Refine   ", memRef, memTot );
    ABC_PRMP( "Memory: Hash     ", memHash,memTot );
    ABC_PRMP( "Memory: Other    ", memOth, memTot );
    ABC_PRMP( "Memory: TOTAL    ", memTot, memTot );
}